

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ZSTD_compressionParameters *cParams;
  BYTE *pInLimit;
  int *piVar1;
  uint uVar2;
  uint uVar3;
  U32 *pUVar4;
  BYTE *pBVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  U32 UVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  BYTE *pBVar19;
  BYTE *pBVar20;
  int *ip;
  int *ip_00;
  int *piVar21;
  uint uVar22;
  ulong uVar23;
  bool bVar24;
  ulong local_c0;
  uint local_a8;
  int *local_a0;
  
  pInLimit = (BYTE *)((long)src + srcSize);
  piVar1 = (int *)((long)src + (srcSize - 8));
  pBVar19 = (ms->window).base + (ms->window).dictLimit;
  uVar2 = *rep;
  uVar3 = rep[1];
  iVar17 = (int)pBVar19;
  ip_00 = (int *)((ulong)((int)src == iVar17) + (long)src);
  ms->nextToUpdate3 = ms->nextToUpdate;
  uVar6 = (int)ip_00 - iVar17;
  local_a8 = uVar3;
  if (uVar6 < uVar3) {
    local_a8 = 0;
  }
  uVar18 = (ulong)uVar2;
  if (uVar6 < uVar2) {
    uVar18 = 0;
  }
  cParams = &ms->cParams;
  do {
    uVar16 = (uint)uVar18;
    lVar11 = -uVar18;
    while( true ) {
      if (piVar1 <= ip_00) {
        uVar10 = 0;
        if (uVar6 < uVar3) {
          uVar10 = uVar3;
        }
        if (uVar6 < uVar2) {
          uVar10 = uVar2;
        }
        if (uVar16 == 0) {
          uVar16 = uVar10;
        }
        if (local_a8 != 0) {
          uVar10 = local_a8;
        }
        *rep = uVar16;
        rep[1] = uVar10;
        return (long)pInLimit - (long)src;
      }
      if (uVar16 == 0) {
        uVar12 = 0;
      }
      else {
        uVar12 = 0;
        if (*(int *)((long)ip_00 + lVar11 + 1) == *(int *)((long)ip_00 + 1)) {
          sVar13 = ZSTD_count((BYTE *)((long)ip_00 + 5),(BYTE *)((long)ip_00 + lVar11 + 5),pInLimit)
          ;
          uVar12 = sVar13 + 4;
        }
      }
      uVar10 = (ms->cParams).minMatch;
      iVar17 = (int)ip_00;
      if (uVar10 - 6 < 2) {
        uVar7 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar4 = ms->chainTable;
        pBVar5 = (ms->window).base;
        uVar10 = (ms->window).lowLimit;
        uVar22 = iVar17 - (int)pBVar5;
        uVar14 = uVar22 - uVar7;
        if (uVar22 < uVar7) {
          uVar14 = 0;
        }
        iVar17 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        uVar8 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip_00,6);
        local_c0 = 999999999;
        uVar23 = 3;
        while( true ) {
          bVar24 = iVar17 == 0;
          iVar17 = iVar17 + -1;
          if ((((uVar8 <= uVar10) || (bVar24)) ||
              ((pBVar20 = pBVar5 + uVar8, pBVar20[uVar23] == *(BYTE *)((long)ip_00 + uVar23) &&
               ((sVar13 = ZSTD_count((BYTE *)ip_00,pBVar20,pInLimit), uVar23 < sVar13 &&
                (local_c0 = (ulong)((uVar22 + 2) - uVar8), uVar23 = sVar13,
                (BYTE *)(sVar13 + (long)ip_00) == pInLimit)))))) || (uVar8 <= uVar14)) break;
          uVar8 = pUVar4[uVar8 & uVar7 - 1];
        }
      }
      else if (uVar10 == 5) {
        uVar7 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar4 = ms->chainTable;
        pBVar5 = (ms->window).base;
        uVar10 = (ms->window).lowLimit;
        uVar22 = iVar17 - (int)pBVar5;
        uVar14 = uVar22 - uVar7;
        if (uVar22 < uVar7) {
          uVar14 = 0;
        }
        iVar17 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        uVar8 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip_00,5);
        local_c0 = 999999999;
        uVar23 = 3;
        while( true ) {
          bVar24 = iVar17 == 0;
          iVar17 = iVar17 + -1;
          if (((uVar8 <= uVar10) || (bVar24)) ||
             (((pBVar20 = pBVar5 + uVar8, pBVar20[uVar23] == *(BYTE *)((long)ip_00 + uVar23) &&
               ((sVar13 = ZSTD_count((BYTE *)ip_00,pBVar20,pInLimit), uVar23 < sVar13 &&
                (local_c0 = (ulong)((uVar22 + 2) - uVar8), uVar23 = sVar13,
                (BYTE *)(sVar13 + (long)ip_00) == pInLimit)))) || (uVar8 <= uVar14)))) break;
          uVar8 = pUVar4[uVar8 & uVar7 - 1];
        }
      }
      else {
        uVar7 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar4 = ms->chainTable;
        pBVar5 = (ms->window).base;
        uVar10 = (ms->window).lowLimit;
        uVar22 = iVar17 - (int)pBVar5;
        uVar14 = uVar22 - uVar7;
        if (uVar22 < uVar7) {
          uVar14 = 0;
        }
        iVar17 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        uVar8 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip_00,4);
        local_c0 = 999999999;
        uVar23 = 3;
        while( true ) {
          bVar24 = iVar17 == 0;
          iVar17 = iVar17 + -1;
          if ((((uVar8 <= uVar10) || (bVar24)) ||
              ((pBVar20 = pBVar5 + uVar8, pBVar20[uVar23] == *(BYTE *)((long)ip_00 + uVar23) &&
               ((sVar13 = ZSTD_count((BYTE *)ip_00,pBVar20,pInLimit), uVar23 < sVar13 &&
                (local_c0 = (ulong)((uVar22 + 2) - uVar8), uVar23 = sVar13,
                (BYTE *)(sVar13 + (long)ip_00) == pInLimit)))))) || (uVar8 <= uVar14)) break;
          uVar8 = pUVar4[uVar8 & uVar7 - 1];
        }
      }
      uVar15 = uVar12;
      if (uVar12 < uVar23) {
        uVar15 = uVar23;
      }
      if (3 < uVar15) break;
      ip_00 = (int *)((long)ip_00 + ((long)ip_00 - (long)src >> 8) + 1);
    }
    if (uVar23 <= uVar12) {
      local_c0 = 0;
    }
    ip = (int *)((long)ip_00 + 1);
    if (uVar12 < uVar23) {
      ip = ip_00;
    }
LAB_0037f627:
    do {
      uVar23 = local_c0;
      uVar12 = uVar15;
      piVar21 = ip_00;
      local_a0 = ip;
      if (piVar1 <= piVar21) break;
      ip_00 = (int *)((long)piVar21 + 1);
      if (uVar23 == 0) {
        uVar23 = 0;
      }
      else if ((uVar16 != 0) && (*ip_00 == *(int *)((long)ip_00 + lVar11))) {
        sVar13 = ZSTD_count((BYTE *)((long)piVar21 + 5),(BYTE *)((long)piVar21 + lVar11 + 5),
                            pInLimit);
        if (sVar13 < 0xfffffffffffffffc) {
          uVar14 = (int)uVar23 + 1;
          uVar10 = 0x1f;
          if (uVar14 != 0) {
            for (; uVar14 >> uVar10 == 0; uVar10 = uVar10 - 1) {
            }
          }
          if ((int)((uVar10 ^ 0x1f) + (int)uVar12 * 3 + -0x1e) < (int)(sVar13 + 4) * 3) {
            uVar23 = 0;
            uVar12 = sVar13 + 4;
            local_a0 = ip_00;
          }
        }
      }
      uVar10 = (ms->cParams).minMatch;
      iVar17 = (int)ip_00;
      if (uVar10 - 6 < 2) {
        uVar7 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar4 = ms->chainTable;
        pBVar5 = (ms->window).base;
        uVar10 = (ms->window).lowLimit;
        uVar22 = iVar17 - (int)pBVar5;
        uVar14 = uVar22 - uVar7;
        if (uVar22 < uVar7) {
          uVar14 = 0;
        }
        iVar17 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        uVar8 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip_00,6);
        local_c0 = 999999999;
        uVar15 = 3;
        while( true ) {
          bVar24 = iVar17 == 0;
          iVar17 = iVar17 + -1;
          if ((((uVar8 <= uVar10) || (bVar24)) ||
              ((pBVar20 = pBVar5 + uVar8, pBVar20[uVar15] == *(BYTE *)((long)ip_00 + uVar15) &&
               ((sVar13 = ZSTD_count((BYTE *)ip_00,pBVar20,pInLimit), uVar15 < sVar13 &&
                (local_c0 = (ulong)((uVar22 + 2) - uVar8), uVar15 = sVar13,
                (BYTE *)(sVar13 + (long)ip_00) == pInLimit)))))) || (uVar8 <= uVar14)) break;
          uVar8 = pUVar4[uVar8 & uVar7 - 1];
        }
      }
      else if (uVar10 == 5) {
        uVar7 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar4 = ms->chainTable;
        pBVar5 = (ms->window).base;
        uVar10 = (ms->window).lowLimit;
        uVar22 = iVar17 - (int)pBVar5;
        uVar14 = uVar22 - uVar7;
        if (uVar22 < uVar7) {
          uVar14 = 0;
        }
        iVar17 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        uVar8 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip_00,5);
        local_c0 = 999999999;
        uVar15 = 3;
        while( true ) {
          bVar24 = iVar17 == 0;
          iVar17 = iVar17 + -1;
          if ((((uVar8 <= uVar10) || (bVar24)) ||
              ((pBVar20 = pBVar5 + uVar8, pBVar20[uVar15] == *(BYTE *)((long)ip_00 + uVar15) &&
               ((sVar13 = ZSTD_count((BYTE *)ip_00,pBVar20,pInLimit), uVar15 < sVar13 &&
                (local_c0 = (ulong)((uVar22 + 2) - uVar8), uVar15 = sVar13,
                (BYTE *)(sVar13 + (long)ip_00) == pInLimit)))))) || (uVar8 <= uVar14)) break;
          uVar8 = pUVar4[uVar8 & uVar7 - 1];
        }
      }
      else {
        uVar7 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar4 = ms->chainTable;
        pBVar5 = (ms->window).base;
        uVar10 = (ms->window).lowLimit;
        uVar22 = iVar17 - (int)pBVar5;
        uVar14 = uVar22 - uVar7;
        if (uVar22 < uVar7) {
          uVar14 = 0;
        }
        iVar17 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        uVar8 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip_00,4);
        local_c0 = 999999999;
        uVar15 = 3;
        while( true ) {
          bVar24 = iVar17 == 0;
          iVar17 = iVar17 + -1;
          if ((((uVar8 <= uVar10) || (bVar24)) ||
              ((pBVar20 = pBVar5 + uVar8, pBVar20[uVar15] == *(BYTE *)((long)ip_00 + uVar15) &&
               ((sVar13 = ZSTD_count((BYTE *)ip_00,pBVar20,pInLimit), uVar15 < sVar13 &&
                (local_c0 = (ulong)((uVar22 + 2) - uVar8), uVar15 = sVar13,
                (BYTE *)(sVar13 + (long)ip_00) == pInLimit)))))) || (uVar8 <= uVar14)) break;
          uVar8 = pUVar4[uVar8 & uVar7 - 1];
        }
      }
      if (3 < uVar15) {
        uVar14 = (int)uVar23 + 1;
        uVar10 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> uVar10 == 0; uVar10 = uVar10 - 1) {
          }
        }
        uVar14 = (int)local_c0 + 1;
        iVar17 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> iVar17 == 0; iVar17 = iVar17 + -1) {
          }
        }
        ip = ip_00;
        if ((int)((uVar10 ^ 0x1f) + (int)uVar12 * 4 + -0x1b) < (int)uVar15 * 4 - iVar17)
        goto LAB_0037f627;
      }
      if (piVar1 <= ip_00) break;
      ip = (int *)((long)piVar21 + 2);
      if (uVar23 == 0) {
        uVar23 = 0;
      }
      else if ((uVar16 != 0) && (*ip == *(int *)((long)ip + lVar11))) {
        sVar13 = ZSTD_count((BYTE *)((long)piVar21 + 6),(BYTE *)((long)piVar21 + lVar11 + 6),
                            pInLimit);
        if (sVar13 < 0xfffffffffffffffc) {
          uVar14 = (int)uVar23 + 1;
          uVar10 = 0x1f;
          if (uVar14 != 0) {
            for (; uVar14 >> uVar10 == 0; uVar10 = uVar10 - 1) {
            }
          }
          if ((int)((uVar10 ^ 0x1f) + (int)uVar12 * 4 + -0x1e) < (int)(sVar13 + 4) * 4) {
            uVar23 = 0;
            uVar12 = sVar13 + 4;
            local_a0 = ip;
          }
        }
      }
      uVar10 = (ms->cParams).minMatch;
      iVar17 = (int)ip;
      if (uVar10 - 6 < 2) {
        uVar7 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar4 = ms->chainTable;
        pBVar5 = (ms->window).base;
        uVar10 = (ms->window).lowLimit;
        uVar22 = iVar17 - (int)pBVar5;
        uVar14 = uVar22 - uVar7;
        if (uVar22 < uVar7) {
          uVar14 = 0;
        }
        iVar17 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        UVar9 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,6);
        local_c0 = 999999999;
        uVar15 = 3;
        while( true ) {
          bVar24 = iVar17 == 0;
          iVar17 = iVar17 + -1;
          if ((((UVar9 <= uVar10) || (bVar24)) ||
              ((pBVar20 = pBVar5 + UVar9, pBVar20[uVar15] == *(BYTE *)((long)ip + uVar15) &&
               ((sVar13 = ZSTD_count((BYTE *)ip,pBVar20,pInLimit), uVar15 < sVar13 &&
                (local_c0 = (ulong)((uVar22 + 2) - UVar9), uVar15 = sVar13,
                (BYTE *)(sVar13 + (long)ip) == pInLimit)))))) || (UVar9 <= uVar14)) break;
          UVar9 = pUVar4[UVar9 & uVar7 - 1];
        }
      }
      else if (uVar10 == 5) {
        uVar7 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar4 = ms->chainTable;
        pBVar5 = (ms->window).base;
        uVar10 = (ms->window).lowLimit;
        uVar22 = iVar17 - (int)pBVar5;
        uVar14 = uVar22 - uVar7;
        if (uVar22 < uVar7) {
          uVar14 = 0;
        }
        iVar17 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        UVar9 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,5);
        local_c0 = 999999999;
        uVar15 = 3;
        while( true ) {
          bVar24 = iVar17 == 0;
          iVar17 = iVar17 + -1;
          if ((((UVar9 <= uVar10) || (bVar24)) ||
              ((pBVar20 = pBVar5 + UVar9, pBVar20[uVar15] == *(BYTE *)((long)ip + uVar15) &&
               ((sVar13 = ZSTD_count((BYTE *)ip,pBVar20,pInLimit), uVar15 < sVar13 &&
                (local_c0 = (ulong)((uVar22 + 2) - UVar9), uVar15 = sVar13,
                (BYTE *)(sVar13 + (long)ip) == pInLimit)))))) || (UVar9 <= uVar14)) break;
          UVar9 = pUVar4[UVar9 & uVar7 - 1];
        }
      }
      else {
        uVar7 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pUVar4 = ms->chainTable;
        pBVar5 = (ms->window).base;
        uVar10 = (ms->window).lowLimit;
        uVar22 = iVar17 - (int)pBVar5;
        uVar14 = uVar22 - uVar7;
        if (uVar22 < uVar7) {
          uVar14 = 0;
        }
        iVar17 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        UVar9 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams,(BYTE *)ip,4);
        local_c0 = 999999999;
        uVar15 = 3;
        while( true ) {
          bVar24 = iVar17 == 0;
          iVar17 = iVar17 + -1;
          if ((((UVar9 <= uVar10) || (bVar24)) ||
              ((pBVar20 = pBVar5 + UVar9, pBVar20[uVar15] == *(BYTE *)((long)ip + uVar15) &&
               ((sVar13 = ZSTD_count((BYTE *)ip,pBVar20,pInLimit), uVar15 < sVar13 &&
                (local_c0 = (ulong)((uVar22 + 2) - UVar9), uVar15 = sVar13,
                (BYTE *)(sVar13 + (long)ip) == pInLimit)))))) || (UVar9 <= uVar14)) break;
          UVar9 = pUVar4[UVar9 & uVar7 - 1];
        }
      }
      if (uVar15 < 4) break;
      uVar14 = (int)uVar23 + 1;
      uVar10 = 0x1f;
      if (uVar14 != 0) {
        for (; uVar14 >> uVar10 == 0; uVar10 = uVar10 - 1) {
        }
      }
      uVar14 = (int)local_c0 + 1;
      iVar17 = 0x1f;
      if (uVar14 != 0) {
        for (; uVar14 >> iVar17 == 0; iVar17 = iVar17 + -1) {
        }
      }
      ip_00 = ip;
    } while ((int)((uVar10 ^ 0x1f) + (int)uVar12 * 4 + -0x18) < (int)uVar15 * 4 - iVar17);
    if (uVar23 == 0) {
      uVar23 = 0;
    }
    else {
      for (; ((src < local_a0 && (pBVar19 < (BYTE *)((long)local_a0 + (2 - uVar23)))) &&
             (*(BYTE *)((long)local_a0 + -1) == *(BYTE *)((long)local_a0 + (1 - uVar23))));
          local_a0 = (int *)((long)local_a0 + -1)) {
        uVar12 = uVar12 + 1;
      }
      uVar18 = (ulong)((int)uVar23 - 2);
      local_a8 = uVar16;
    }
    ZSTD_storeSeq(seqStore,(long)local_a0 - (long)src,src,(U32)uVar23,uVar12 - 3);
    for (ip_00 = (int *)((long)local_a0 + uVar12);
        ((src = ip_00, local_a8 != 0 && (ip_00 <= piVar1)) &&
        (*ip_00 == *(int *)((long)ip_00 - (ulong)local_a8)));
        ip_00 = (int *)((long)ip_00 + sVar13 + 4)) {
      sVar13 = ZSTD_count((BYTE *)(ip_00 + 1),(BYTE *)((long)ip_00 + (4 - (ulong)local_a8)),pInLimit
                         );
      ZSTD_storeSeq(seqStore,0,ip_00,0,sVar13 + 1);
      uVar12 = (ulong)local_a8;
      local_a8 = (uint)uVar18;
      uVar18 = uVar12;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, 0, 2, ZSTD_noDict);
}